

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhandler.cc
# Opt level: O2

int __thiscall
BdCallback::dhtValueCallback(BdCallback *this,bdNodeId *id,string *key,uint32_t status)

{
  BitDhtHandler *pBVar1;
  int iVar2;
  string local_40 [32];
  
  pBVar1 = this->mParent;
  std::__cxx11::string::string(local_40,(string *)key);
  iVar2 = (*pBVar1->_vptr_BitDhtHandler[2])(pBVar1,id,local_40,(ulong)status);
  std::__cxx11::string::~string(local_40);
  return iVar2;
}

Assistant:

virtual int dhtValueCallback(const bdNodeId *id, std::string key, uint32_t status) {
        return mParent->ValueCallback(id, key, status);
    }